

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O2

void print_values(sensor *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  uint i;
  uint index;
  float fVar5;
  string local_50;
  
  iVar1 = ev3dev::sensor::decimals(s);
  uVar2 = ev3dev::sensor::num_values(s);
  for (index = 0; uVar2 != index; index = index + 1) {
    if (index != 0) {
      std::operator<<((ostream *)&std::cout,"; ");
    }
    if (iVar1 == 0) {
      iVar3 = ev3dev::sensor::value(s,index);
      std::ostream::operator<<(&std::cout,iVar3);
    }
    else {
      fVar5 = ev3dev::sensor::float_value(s,index);
      std::ostream::operator<<(&std::cout,fVar5);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  ev3dev::sensor::units_abi_cxx11_(&local_50,s);
  std::operator<<(poVar4,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void print_values(sensor &s)
{
  auto dp = s.decimals();
  unsigned m = s.num_values();
  for (unsigned i=0; i<m; ++i)
  {
    if (i) cout << "; ";
    if (dp)
      cout << s.float_value(i);
    else
      cout << s.value(i);
  }
  cout << " " << s.units();
}